

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.cpp
# Opt level: O0

size_t duckdb_zstd::HIST_count_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,void *workSpace
                 ,size_t workSpaceSize)

{
  void *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  ulong in_R8;
  void *in_R9;
  uint *in_stack_00000030;
  uint *in_stack_00000038;
  undefined8 local_8;
  
  if ((in_R8 & 3) == 0) {
    if (in_R9 < (void *)0x1000) {
      local_8 = 0xffffffffffffffbe;
    }
    else if (*in_RSI < 0xff) {
      local_8 = HIST_count_parallel_wksp
                          (in_stack_00000038,in_stack_00000030,count,(size_t)maxSymbolValuePtr,
                           source._4_4_,(U32 *)sourceSize);
    }
    else {
      *in_RSI = 0xff;
      local_8 = HIST_countFast_wksp(in_RSI,in_RDX,in_RCX,in_R8,in_R9,0xa71f75);
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

size_t HIST_count_wksp(unsigned* count, unsigned* maxSymbolValuePtr,
                       const void* source, size_t sourceSize,
                       void* workSpace, size_t workSpaceSize)
{
    if ((size_t)workSpace & 3) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (workSpaceSize < HIST_WKSP_SIZE) return ERROR(workSpace_tooSmall);
    if (*maxSymbolValuePtr < 255)
        return HIST_count_parallel_wksp(count, maxSymbolValuePtr, source, sourceSize, checkMaxSymbolValue, (U32*)workSpace);
    *maxSymbolValuePtr = 255;
    return HIST_countFast_wksp(count, maxSymbolValuePtr, source, sourceSize, workSpace, workSpaceSize);
}